

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O2

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,close_status_code status)

{
  ushort d;
  span<const_unsigned_char,__1L> *in_R9;
  span<const_unsigned_short,__1L> sVar1;
  span<const_unsigned_short,__1L> s;
  uint16_t ns;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_30;
  
  d = (ushort)io._M_data;
  log<unsigned_short>(info,"Sending close frame code=",d);
  ns = d << 8 | d >> 8;
  sVar1 = pstore::gsl::make_span<unsigned_short_const>(&ns,1);
  s.storage_.data_ = (index_type)sVar1.storage_.data_;
  s.storage_.super_extent_type<_1L>.size_ = s.storage_.data_;
  local_30 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::as_bytes<unsigned_short_const,_1l>
                       ((gsl *)sVar1.storage_.super_extent_type<_1L>.size_.size_,s);
  send_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (__return_storage_ptr__,this,sender,
             (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
              )0x8,(opcode)&local_30,in_R9);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_close_frame (Sender const sender, IO const io,
                                       close_status_code const status) {
            log (logger::priority::info,
                 "Sending close frame code=", static_cast<std::uint16_t> (status));
            PSTORE_STATIC_ASSERT ((
                std::is_same<std::underlying_type<close_status_code>::type, std::uint16_t>::value));
            std::uint16_t const ns = host_to_network (static_cast<std::uint16_t> (status));
            return send_message (sender, io, opcode::close, as_bytes (gsl::make_span (&ns, 1)));
        }